

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void BuilderTests<TestHeapBuilder,_TestHeapBuilder>::builder_move_assign_after_release_test(void)

{
  Color color;
  bool val;
  Offset<MyGame::Example::Monster> root;
  SizeT SVar1;
  string local_180;
  SizeT local_15c;
  offset_type local_158;
  SizeT src_size;
  undefined1 local_150 [4];
  Offset<MyGame::Example::Monster> root_offset2;
  TestHeapBuilder src;
  DetachedBuffer dst_detached;
  undefined1 local_88 [4];
  Offset<MyGame::Example::Monster> root_offset1;
  TestHeapBuilder dst;
  
  TestHeapBuilder::TestHeapBuilder((TestHeapBuilder *)local_88);
  root = populate1((FlatBufferBuilder *)local_88);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
            ((FlatBufferBuilderImpl<false> *)local_88,root,(char *)0x0);
  flatbuffers::FlatBufferBuilderImpl<false>::Release
            ((DetachedBuffer *)&src.super_FlatBufferBuilder.string_pool,
             (FlatBufferBuilderImpl<false> *)local_88);
  flatbuffers::DetachedBuffer::~DetachedBuffer
            ((DetachedBuffer *)&src.super_FlatBufferBuilder.string_pool);
  TestHeapBuilder::TestHeapBuilder((TestHeapBuilder *)local_150);
  local_158 = (offset_type)populate2((FlatBufferBuilder *)local_150);
  src_size = local_158;
  flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
            ((FlatBufferBuilderImpl<false> *)local_150,(Offset<MyGame::Example::Monster>)local_158,
             (char *)0x0);
  local_15c = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                        ((FlatBufferBuilderImpl<false> *)local_150);
  TestHeapBuilder::operator=((TestHeapBuilder *)local_88,(TestHeapBuilder *)local_150);
  SVar1 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)local_88);
  TestEq<unsigned_int,unsigned_int>
            (SVar1,local_15c,"\'dst.GetSize()\' != \'src_size\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x9f,
             "static void BuilderTests<TestHeapBuilder>::builder_move_assign_after_release_test() [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
            );
  m2_name_abi_cxx11_();
  color = m2_color();
  val = release_n_verify((FlatBufferBuilder *)local_88,&local_180,color);
  TestEq<bool,bool>(true,val,"\'true\' != \'release_n_verify(dst, m2_name(), m2_color())\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                    ,0xa0,
                    "static void BuilderTests<TestHeapBuilder>::builder_move_assign_after_release_test() [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                   );
  std::__cxx11::string::~string((string *)&local_180);
  SVar1 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)local_150);
  TestEq<unsigned_int,int>
            (SVar1,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0xa1,
             "static void BuilderTests<TestHeapBuilder>::builder_move_assign_after_release_test() [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
            );
  TestHeapBuilder::~TestHeapBuilder((TestHeapBuilder *)local_150);
  TestHeapBuilder::~TestHeapBuilder((TestHeapBuilder *)local_88);
  return;
}

Assistant:

static void builder_move_assign_after_release_test() {
    DestBuilder dst;
    auto root_offset1 = populate1(dst);
    dst.Finish(root_offset1);
    {
      flatbuffers::DetachedBuffer dst_detached = dst.Release();
      // detached buffer is deleted
    }
    SrcBuilder src;
    auto root_offset2 = populate2(src);
    src.Finish(root_offset2);
    auto src_size = src.GetSize();
    // Move into a released builder.
    dst = std::move(src);
    TEST_EQ_FUNC(dst.GetSize(), src_size);
    TEST_ASSERT_FUNC(release_n_verify(dst, m2_name(), m2_color()));
    TEST_EQ_FUNC(src.GetSize(), 0);
  }